

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmQtAutoGenInitializer::RegisterGeneratedSource(cmQtAutoGenInitializer *this,string *filename)

{
  cmSourceFile *this_00;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48 [32];
  string local_28;
  
  this_00 = cmMakefile::GetOrCreateSource(this->Makefile,filename,true,Ambiguous);
  cmSourceFile::MarkAsGenerated(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"SKIP_AUTOGEN",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"1",&local_4a);
  cmSourceFile::SetProperty(this_00,&local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"SKIP_LINTING",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"ON",&local_4a);
  cmSourceFile::SetProperty(this_00,&local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CXX_SCAN_FOR_MODULES",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"0",&local_4a);
  cmSourceFile::SetProperty(this_00,&local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return this_00;
}

Assistant:

cmSourceFile* cmQtAutoGenInitializer::RegisterGeneratedSource(
  std::string const& filename)
{
  cmSourceFile* gFile = this->Makefile->GetOrCreateSource(filename, true);
  gFile->MarkAsGenerated();
  gFile->SetProperty("SKIP_AUTOGEN", "1");
  gFile->SetProperty("SKIP_LINTING", "ON");
  gFile->SetProperty("CXX_SCAN_FOR_MODULES", "0");
  return gFile;
}